

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

int menu_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int item_right;
  int item_width;
  int item_left;
  Am_Object item;
  Am_Widget_Look local_38;
  int width;
  Am_Widget_Look look;
  int local_24;
  undefined1 local_20 [4];
  int border;
  Am_Value_List components;
  Am_Object *self_local;
  
  components.item = (Am_List_Item *)self;
  pAVar4 = Am_Object::Get(self,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x1c8,0);
  local_24 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_38,pAVar4);
  item.data._4_4_ = 0;
  Am_Object::Am_Object((Am_Object *)&item_width);
  Am_Value_List::Start((Am_Value_List *)local_20);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar4 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=((Am_Object *)&item_width,pAVar4);
    pAVar4 = Am_Object::Get((Am_Object *)&item_width,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar1) {
      pAVar4 = Am_Object::Get((Am_Object *)&item_width,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get((Am_Object *)&item_width,0x66,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (item.data._4_4_ < iVar2 + iVar3) {
        item.data._4_4_ = iVar2 + iVar3;
      }
    }
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  bVar1 = Am_Widget_Look::operator==(&local_38,&Am_MACINTOSH_LOOK);
  if (bVar1) {
    local_24 = local_24 + 1;
  }
  local_24 = item.data._4_4_ + local_24;
  Am_Object::~Am_Object((Am_Object *)&item_width);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return local_24;
}

Assistant:

Am_Define_Formula(int, menu_width)
{
  // based on Am_map_width in opal.cc
  // the border depends upon the widget look;

  Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
  int border = self.Get(Am_MENU_BORDER);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  int width = 0;
  Am_Object item;

  for (components.Start(); !components.Last(); components.Next()) {
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int item_left = item.Get(Am_LEFT);
      int item_width = item.Get(Am_WIDTH);
      int item_right = item_left + item_width;
      if (item_right > width)
        width = item_right;
    }
  }

  if (look == Am_MACINTOSH_LOOK)
    border++;
  return width + border; // we are adding the right border, Am_LEFT_OFFSET takes
                         // care of the left border
}